

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O2

LINE_SIDE rr::LineRasterUtil::getVertexSide(Vector<long,_2> *v,SubpixelLineSegment *l)

{
  bool bVar1;
  LINE_SIDE LVar2;
  Vector<long,_2> v_1;
  Vector<long,_2> u;
  
  bVar1 = vertexOnLeftSideOfLine(v,l);
  if (bVar1) {
    LVar2 = LINE_SIDE_LEFT;
  }
  else {
    SubpixelLineSegment::direction((SubpixelLineSegment *)&u);
    tcu::operator-(v,&l->m_v0);
    if (v_1.m_data[1] * u.m_data[0] - v_1.m_data[0] * u.m_data[1] < 1) {
      vertexOnLine(v,l);
      LVar2 = LINE_SIDE_INTERSECT;
    }
    else {
      LVar2 = LINE_SIDE_RIGHT;
    }
  }
  return LVar2;
}

Assistant:

static LINE_SIDE getVertexSide (const tcu::Vector<deInt64,2>& v, const SubpixelLineSegment& l)
{
	if (vertexOnLeftSideOfLine(v, l))
		return LINE_SIDE_LEFT;
	else if (vertexOnRightSideOfLine(v, l))
		return LINE_SIDE_RIGHT;
	else if (vertexOnLine(v, l))
		return LINE_SIDE_INTERSECT;
	else
	{
		DE_ASSERT(false);
		return LINE_SIDE_INTERSECT;
	}
}